

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O2

Clause * __thiscall
Inferences::DuplicateLiteralRemovalISE::simplify(DuplicateLiteralRemovalISE *this,Clause *c)

{
  Literal *pLVar1;
  bool bVar2;
  int iVar3;
  Literal **ppLVar4;
  Clause *pCVar5;
  long lVar6;
  uint uVar7;
  Literal *elem;
  uint uVar8;
  size_t s;
  uint uVar9;
  Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> resLits;
  Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_80;
  SimplifyingInference1 local_70;
  Inference local_60;
  
  uVar8 = *(uint *)&c->field_0x38 & 0xfffff;
  if (uVar8 < 2) {
    return c;
  }
  if ((simplify(Kernel::Clause*)::skipped == '\0') &&
     (iVar3 = __cxa_guard_acquire(&simplify(Kernel::Clause*)::skipped), iVar3 != 0)) {
    simplify::skipped._cursor = (Literal **)0x0;
    simplify::skipped._end = (Literal **)0x0;
    simplify::skipped._capacity = 0;
    simplify::skipped._stack = (Literal **)0x0;
    __cxa_atexit(Lib::Stack<Kernel::Literal_*>::~Stack,&simplify::skipped,&__dso_handle);
    __cxa_guard_release(&simplify(Kernel::Clause*)::skipped);
  }
  simplify::skipped._cursor = simplify::skipped._stack;
  if (uVar8 == 3) {
    pLVar1 = c->_literals[0];
    if (pLVar1 == *(Literal **)&c[1].super_Unit) {
      Lib::Stack<Kernel::Literal_*>::push(&simplify::skipped,pLVar1);
      elem = c->_literals[0];
      if (elem != *(Literal **)&c[1].super_Unit._inference) goto LAB_00402fb0;
    }
    else {
      elem = *(Literal **)&c[1].super_Unit._inference;
      if (*(Literal **)&c[1].super_Unit != elem && pLVar1 != elem) {
        simplify::skipped._cursor = simplify::skipped._stack;
        return c;
      }
    }
  }
  else {
    if (uVar8 != 2) {
      if ((simplify(Kernel::Clause*)::seen == '\0') &&
         (iVar3 = __cxa_guard_acquire(&simplify(Kernel::Clause*)::seen), iVar3 != 0)) {
        simplify::seen._map._timestamp = 1;
        simplify::seen._map._size = 0;
        simplify::seen._map._deleted = 0;
        simplify::seen._map._capacityIndex = 0;
        simplify::seen._map._capacity = 0;
        simplify::seen._map._20_8_ = 0;
        simplify::seen._map._28_8_ = 0;
        simplify::seen._map._afterLast._4_4_ = 0;
        __cxa_atexit(Lib::DHSet<Kernel::Literal_*,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHSet,
                     &simplify::seen,&__dso_handle);
        __cxa_guard_release(&simplify(Kernel::Clause*)::seen);
      }
      Lib::DHMap<Kernel::Literal_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
                (&simplify::seen._map);
      uVar7 = *(uint *)&c->field_0x38 & 0xfffff;
      uVar9 = (uint)(uVar7 != 0);
      ppLVar4 = (Literal **)0x0;
      if (uVar7 != 0) {
        ppLVar4 = c->_literals;
      }
      while (ppLVar4 != (Literal **)0x0) {
        pLVar1 = *ppLVar4;
        bVar2 = Lib::DHMap<Kernel::Literal_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                ::insert(&simplify::seen._map,pLVar1);
        if (!bVar2) {
          Lib::Stack<Kernel::Literal_*>::push(&simplify::skipped,pLVar1);
        }
        ppLVar4 = c->_literals + (int)uVar9;
        if (uVar7 <= uVar9) {
          ppLVar4 = (Literal **)0x0;
        }
        uVar9 = uVar9 + (uVar9 < uVar7);
      }
      if (simplify::skipped._cursor == simplify::skipped._stack) {
        return c;
      }
      goto LAB_00402fb0;
    }
    elem = c->_literals[0];
    if (elem != *(Literal **)&c[1].super_Unit) {
      simplify::skipped._cursor = simplify::skipped._stack;
      return c;
    }
  }
  Lib::Stack<Kernel::Literal_*>::push(&simplify::skipped,elem);
LAB_00402fb0:
  iVar3 = (int)((ulong)((long)simplify::skipped._cursor - (long)simplify::skipped._stack) >> 3);
  uVar7 = uVar8 - iVar3;
  Lib::Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled(&local_80);
  s = (size_t)(int)uVar7;
  Lib::DArray<Kernel::Literal_*>::ensure
            ((DArray<Kernel::Literal_*> *)
             local_80._self._M_t.
             super___uniq_ptr_impl<Lib::DArray<Kernel::Literal_*>,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::DArray<Kernel::Literal_*>_*,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
             .super__Head_base<0UL,_Lib::DArray<Kernel::Literal_*>_*,_false>._M_head_impl,s);
  while (0 < (long)s) {
    s = s - 1;
    ppLVar4 = c->_literals + (long)(int)uVar8 + -1;
    lVar6 = (long)(int)uVar8 << 0x20;
    while( true ) {
      uVar8 = uVar8 - 1;
      lVar6 = lVar6 + -0x100000000;
      if ((simplify::skipped._cursor == simplify::skipped._stack) ||
         (*ppLVar4 != simplify::skipped._cursor[-1])) break;
      ppLVar4 = ppLVar4 + -1;
      simplify::skipped._cursor = simplify::skipped._cursor + -1;
    }
    (*(Literal ***)
      ((long)local_80._self._M_t.
             super___uniq_ptr_impl<Lib::DArray<Kernel::Literal_*>,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::DArray<Kernel::Literal_*>_*,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
             .super__Head_base<0UL,_Lib::DArray<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10))
    [s] = *(Literal **)((long)c->_literals + (lVar6 >> 0x1d));
  }
  *(int *)(DAT_00a141a0 + 0x138) = *(int *)(DAT_00a141a0 + 0x138) + iVar3;
  ppLVar4 = *(Literal ***)
             ((long)local_80._self._M_t.
                    super___uniq_ptr_impl<Lib::DArray<Kernel::Literal_*>,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::DArray<Kernel::Literal_*>_*,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
                    .super__Head_base<0UL,_Lib::DArray<Kernel::Literal_*>_*,_false>._M_head_impl +
             0x10);
  local_70.rule = REMOVE_DUPLICATE_LITERALS;
  local_70.premise = c;
  Kernel::Inference::Inference(&local_60,&local_70);
  pCVar5 = Kernel::Clause::fromArray(ppLVar4,uVar7,&local_60);
  Lib::Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_80);
  return pCVar5;
}

Assistant:

Clause* DuplicateLiteralRemovalISE::simplify(Clause* c)
{
  int length = c->length();
  if (length <= 1) {
    return c;
  }

  //literals that will be skipped, skipping starts on the top of the stack
  //and goes from the end of the clause
  static LiteralStack skipped;
  skipped.reset();

  //we handle low length specially, not to have to use the set
  if(length==2) {
    if((*c)[0]!=(*c)[1]) {
      return c;
    }
    skipped.push((*c)[0]);
  }
  else if(length==3) {
    if((*c)[0]!=(*c)[1]) {
      if((*c)[0]!=(*c)[2]) {
        if((*c)[1]!=(*c)[2]) {
          return c;
        }
      }
      skipped.push((*c)[2]);
    }
    else { //(*c)[0]==(*c)[1]
      skipped.push((*c)[0]);
      if((*c)[0]==(*c)[2]) {
        //all are equal
        skipped.push((*c)[0]);
      }
    }
  }
  else {
    static DHSet<Literal*> seen;
    seen.reset();
    //here we rely on the fact that the iterator traverses the clause from
    //the first to the last literal
    for (Literal* lit : c->iterLits()) {
      if(!seen.insert(lit)) {
        skipped.push(lit);
      }
    }
    if(skipped.isEmpty()) {
      return c;
    }
  }

  ASS(skipped.isNonEmpty());

  // there are duplicate literals, delete them from lits
  int newLength = length - skipped.length();
  // now lits[0 ... newLength-1] contain the remaining literals
  Recycled<DArray<Literal*>> resLits;
  resLits->ensure(newLength);

  int origIdx = length-1;

  for(int newIdx=newLength-1; newIdx>=0; newIdx--,origIdx--) {
    while(skipped.isNonEmpty() && (*c)[origIdx]==skipped.top()) {
      skipped.pop();
      origIdx--;
      ASS_GE(origIdx,0);
    }
    (*resLits)[newIdx] = (*c)[origIdx];
  }
  ASS(skipped.isEmpty());
  ASS_EQ(origIdx,-1);
  env.statistics->duplicateLiterals += length - newLength;

#if DEBUG_DUPLICATE_LITERALS
  {
    static DHSet<Literal*> origLits;
    origLits.reset();
    static DHSet<Literal*> newLits;
    newLits.reset();
    origLits.loadFromIterator(c->iterLits());
    newLits.loadFromIterator(d->iterLits());
    ASS_EQ(origLits.size(),newLits.size());
    ASS_EQ(origLits.size(), static_cast<unsigned>(newLength));
  }
#endif

  return Clause::fromArray(resLits->begin(), newLength,
			 SimplifyingInference1(InferenceRule::REMOVE_DUPLICATE_LITERALS,c));
}